

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O1

bool __thiscall bssl::Vector<TagAndArray>::Push(Vector<TagAndArray> *this,TagAndArray *elem)

{
  undefined8 *puVar1;
  TagAndArray *pTVar2;
  undefined8 uVar3;
  size_t sVar4;
  size_t sVar5;
  TagAndArray *pTVar6;
  TagAndArray *pTVar7;
  ulong uVar8;
  int line;
  long lVar9;
  bool bVar10;
  
  uVar8 = this->capacity_;
  bVar10 = true;
  if (this->size_ < uVar8) goto LAB_00327a2b;
  if (uVar8 == 0) {
    uVar8 = 0x10;
LAB_003278e8:
    if (uVar8 >> 0x3b == 0) {
      pTVar6 = (TagAndArray *)OPENSSL_malloc(uVar8 << 5);
      bVar10 = pTVar6 != (TagAndArray *)0x0;
      if (bVar10) {
        sVar4 = this->size_;
        if (sVar4 != 0) {
          pTVar2 = this->data_;
          lVar9 = 0;
          do {
            *(undefined8 *)((long)&pTVar6->tag + lVar9) =
                 *(undefined8 *)((long)&pTVar2->tag + lVar9);
            puVar1 = (undefined8 *)((long)&(pTVar6->vec).data_ + lVar9);
            *puVar1 = 0;
            puVar1[1] = 0;
            *(undefined8 *)((long)&(pTVar6->vec).capacity_ + lVar9) = 0;
            OPENSSL_free((void *)0x0);
            puVar1 = (undefined8 *)((long)&(pTVar6->vec).data_ + lVar9);
            *puVar1 = 0;
            puVar1[1] = 0;
            puVar1[2] = 0;
            *puVar1 = *(undefined8 *)((long)&(pTVar2->vec).data_ + lVar9);
            *(undefined8 *)((long)&(pTVar2->vec).data_ + lVar9) = 0;
            uVar3 = puVar1[1];
            puVar1[1] = *(undefined8 *)((long)&(pTVar2->vec).size_ + lVar9);
            *(undefined8 *)((long)&(pTVar2->vec).size_ + lVar9) = uVar3;
            uVar3 = puVar1[2];
            puVar1[2] = *(undefined8 *)((long)&(pTVar2->vec).capacity_ + lVar9);
            *(undefined8 *)((long)&(pTVar2->vec).capacity_ + lVar9) = uVar3;
            pTVar7 = (TagAndArray *)((long)&pTVar2[1].tag + lVar9);
            lVar9 = lVar9 + 0x20;
          } while (pTVar7 != pTVar2 + sVar4);
        }
        clear(this);
        this->data_ = pTVar6;
        this->size_ = sVar4;
        this->capacity_ = uVar8;
        bVar10 = true;
      }
      goto LAB_00327a2b;
    }
    line = 0x153;
  }
  else {
    if (-1 < (long)uVar8) {
      uVar8 = uVar8 * 2;
      goto LAB_003278e8;
    }
    line = 0x14d;
  }
  bVar10 = false;
  ERR_put_error(0xe,0,0x45,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_internal.h"
                ,line);
LAB_00327a2b:
  if (bVar10 != false) {
    pTVar6 = this->data_;
    sVar4 = this->size_;
    pTVar6[sVar4].tag = elem->tag;
    pTVar6[sVar4].vec.data_ = (unsigned_long *)0x0;
    pTVar6[sVar4].vec.size_ = 0;
    pTVar6[sVar4].vec.capacity_ = 0;
    OPENSSL_free((void *)0x0);
    pTVar6[sVar4].vec.capacity_ = 0;
    pTVar6[sVar4].vec.data_ = (unsigned_long *)0x0;
    pTVar6[sVar4].vec.size_ = 0;
    pTVar6[sVar4].vec.data_ = (elem->vec).data_;
    (elem->vec).data_ = (unsigned_long *)0x0;
    sVar5 = pTVar6[sVar4].vec.size_;
    pTVar6[sVar4].vec.size_ = (elem->vec).size_;
    (elem->vec).size_ = sVar5;
    sVar5 = pTVar6[sVar4].vec.capacity_;
    pTVar6[sVar4].vec.capacity_ = (elem->vec).capacity_;
    (elem->vec).capacity_ = sVar5;
    this->size_ = this->size_ + 1;
  }
  return bVar10;
}

Assistant:

[[nodiscard]] bool Push(T elem) {
    if (!MaybeGrow()) {
      return false;
    }
    new (&data_[size_]) T(std::move(elem));
    size_++;
    return true;
  }